

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrload.c
# Opt level: O1

FT_Error pfr_extra_item_load_kerning_pairs(FT_Byte *p,FT_Byte *limit,PFR_PhyFont phy_font)

{
  FT_Byte *pFVar1;
  byte bVar2;
  byte bVar3;
  FT_Memory memory;
  PFR_KernItem_conflict P;
  uint uVar4;
  FT_UInt FVar5;
  uint uVar6;
  ulong uVar7;
  FT_Error error;
  FT_Error local_2c;
  
  local_2c = 0;
  memory = phy_font->memory;
  P = (PFR_KernItem_conflict)ft_mem_alloc(memory,0x20,&local_2c);
  if (local_2c == 0) {
    pFVar1 = p + 4;
    if (pFVar1 <= limit) {
      bVar2 = *p;
      P->pair_count = bVar2;
      P->base_adj = *(ushort *)(p + 1) << 8 | *(ushort *)(p + 1) >> 8;
      bVar3 = p[3];
      P->flags = bVar3;
      P->offset = (FT_Offset)(pFVar1 + ((ulong)phy_font->offset - (long)phy_font->cursor));
      FVar5 = (bVar3 & 1) * 2 + 3 + (uint)((bVar3 >> 1 & 1) != 0);
      P->pair_size = FVar5;
      uVar4 = (uint)bVar2;
      if (pFVar1 + FVar5 * uVar4 <= limit) {
        if (uVar4 != 0) {
          if ((P->flags & 1) == 0) {
            P->pair1 = (uint)p[4] << 0x10 | (uint)p[5];
            uVar7 = (ulong)((bVar2 - 1) * FVar5);
            uVar6 = (uint)p[uVar7 + 4] << 0x10 | (uint)p[uVar7 + 5];
          }
          else {
            uVar6 = *(uint *)(p + 4);
            P->pair1 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                       uVar6 << 0x18;
            uVar6 = *(uint *)(p + (ulong)((bVar2 - 1) * FVar5) + 4);
            uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
          }
          P->pair2 = uVar6;
          P->next = (PFR_KernItem)0x0;
          *phy_font->kern_items_tail = P;
          phy_font->kern_items_tail = (PFR_KernItem_conflict *)P;
          phy_font->num_kern_pairs = phy_font->num_kern_pairs + uVar4;
          return 0;
        }
        ft_mem_free(memory,P);
        return local_2c;
      }
    }
    ft_mem_free(memory,P);
    local_2c = 8;
  }
  return local_2c;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  pfr_extra_item_load_kerning_pairs( FT_Byte*     p,
                                     FT_Byte*     limit,
                                     PFR_PhyFont  phy_font )
  {
    PFR_KernItem  item   = NULL;
    FT_Error      error  = FT_Err_Ok;
    FT_Memory     memory = phy_font->memory;


    if ( FT_NEW( item ) )
      goto Exit;

    PFR_CHECK( 4 );

    item->pair_count = PFR_NEXT_BYTE( p );
    item->base_adj   = PFR_NEXT_SHORT( p );
    item->flags      = PFR_NEXT_BYTE( p );
    item->offset     = phy_font->offset +
                       (FT_Offset)( p - phy_font->cursor );

#ifndef PFR_CONFIG_NO_CHECKS
    item->pair_size = 3;

    if ( item->flags & PFR_KERN_2BYTE_CHAR )
      item->pair_size += 2;

    if ( item->flags & PFR_KERN_2BYTE_ADJ )
      item->pair_size += 1;

    PFR_CHECK( item->pair_count * item->pair_size );
#endif

    /* load first and last pairs into the item to speed up */
    /* lookup later...                                     */
    if ( item->pair_count > 0 )
    {
      FT_UInt   char1, char2;
      FT_Byte*  q;


      if ( item->flags & PFR_KERN_2BYTE_CHAR )
      {
        q     = p;
        char1 = PFR_NEXT_USHORT( q );
        char2 = PFR_NEXT_USHORT( q );

        item->pair1 = PFR_KERN_INDEX( char1, char2 );

        q = p + item->pair_size * ( item->pair_count - 1 );
        char1 = PFR_NEXT_USHORT( q );
        char2 = PFR_NEXT_USHORT( q );

        item->pair2 = PFR_KERN_INDEX( char1, char2 );
      }
      else
      {
        q     = p;
        char1 = PFR_NEXT_BYTE( q );
        char2 = PFR_NEXT_BYTE( q );

        item->pair1 = PFR_KERN_INDEX( char1, char2 );

        q = p + item->pair_size * ( item->pair_count - 1 );
        char1 = PFR_NEXT_BYTE( q );
        char2 = PFR_NEXT_BYTE( q );

        item->pair2 = PFR_KERN_INDEX( char1, char2 );
      }

      /* add new item to the current list */
      item->next                 = NULL;
      *phy_font->kern_items_tail = item;
      phy_font->kern_items_tail  = &item->next;
      phy_font->num_kern_pairs  += item->pair_count;
    }
    else
    {
      /* empty item! */
      FT_FREE( item );
    }

  Exit:
    return error;

  Too_Short:
    FT_FREE( item );

    error = FT_THROW( Invalid_Table );
    FT_ERROR(( "pfr_extra_item_load_kerning_pairs:"
               " invalid kerning pairs table\n" ));
    goto Exit;
  }